

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitDsd.c
# Opt level: O0

int Kit_DsdExpandNode_rec(Kit_DsdNtk_t *pNew,Kit_DsdNtk_t *p,int iLit)

{
  ushort uVar1;
  Kit_DsdObj_t KVar2;
  int iVar3;
  uint uVar4;
  Kit_DsdObj_t *pKVar5;
  Kit_DsdObj_t *pObj_00;
  uint *pIn;
  uint *pOut;
  uint local_a4;
  uchar Temp;
  int fCompl;
  Kit_DsdObj_t *pObjNew;
  Kit_DsdObj_t *pObj;
  uint local_88;
  uint nLitsNew;
  uint piLitsNew [16];
  uint local_3c;
  uint iLitFanin;
  uint i;
  uint *pTruthNew;
  uint *pTruth;
  int iLit_local;
  Kit_DsdNtk_t *p_local;
  Kit_DsdNtk_t *pNew_local;
  
  pObj._4_4_ = 0;
  iVar3 = Abc_Lit2Var(iLit);
  pKVar5 = Kit_DsdNtkObj(p,iVar3);
  pNew_local._4_4_ = iLit;
  if (pKVar5 != (Kit_DsdObj_t *)0x0) {
    if (((uint)*pKVar5 >> 6 & 7) == 3) {
      uVar4 = Abc_LitRegular(iLit);
      Kit_DsdExpandCollectAnd_rec(p,uVar4,&local_88,(int *)((long)&pObj + 4));
      pKVar5 = Kit_DsdObjAlloc(pNew,KIT_DSD_AND,pObj._4_4_);
      for (local_3c = 0; local_3c < (uint)*pKVar5 >> 0x1a; local_3c = local_3c + 1) {
        iVar3 = Kit_DsdExpandNode_rec(pNew,p,(&local_88)[local_3c]);
        *(short *)(&pKVar5[1].field_0x0 + (ulong)local_3c * 2) = (short)iVar3;
      }
      KVar2 = *pKVar5;
      iVar3 = Abc_LitIsCompl(iLit);
      pNew_local._4_4_ = Abc_Var2Lit((uint)KVar2 & 0x3f,iVar3);
    }
    else if (((uint)*pKVar5 >> 6 & 7) == 4) {
      local_a4 = Abc_LitIsCompl(iLit);
      uVar4 = Abc_LitRegular(iLit);
      Kit_DsdExpandCollectXor_rec(p,uVar4,&local_88,(int *)((long)&pObj + 4));
      pKVar5 = Kit_DsdObjAlloc(pNew,KIT_DSD_XOR,pObj._4_4_);
      for (local_3c = 0; local_3c < (uint)*pKVar5 >> 0x1a; local_3c = local_3c + 1) {
        iVar3 = Abc_LitRegular((&local_88)[local_3c]);
        iVar3 = Kit_DsdExpandNode_rec(pNew,p,iVar3);
        *(short *)(&pKVar5[1].field_0x0 + (ulong)local_3c * 2) = (short)iVar3;
        uVar4 = Abc_LitIsCompl((&local_88)[local_3c]);
        local_a4 = uVar4 ^ local_a4;
      }
      pNew_local._4_4_ = Abc_Var2Lit((uint)*pKVar5 & 0x3f,local_a4);
    }
    else {
      if (((uint)*pKVar5 >> 6 & 7) != 5) {
        __assert_fail("pObj->Type == KIT_DSD_PRIME",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bool/kit/kitDsd.c"
                      ,0x564,"int Kit_DsdExpandNode_rec(Kit_DsdNtk_t *, Kit_DsdNtk_t *, int)");
      }
      pObj_00 = Kit_DsdObjAlloc(pNew,KIT_DSD_PRIME,(uint)*pKVar5 >> 0x1a);
      pIn = Kit_DsdObjTruth(pKVar5);
      pOut = Kit_DsdObjTruth(pObj_00);
      Kit_TruthCopy(pOut,pIn,(uint)*pKVar5 >> 0x1a);
      for (local_3c = 0; local_3c < (uint)*pKVar5 >> 0x1a; local_3c = local_3c + 1) {
        iVar3 = Kit_DsdExpandNode_rec
                          (pNew,p,(uint)*(ushort *)(&pKVar5[1].field_0x0 + (ulong)local_3c * 2));
        *(short *)(&pObj_00[1].field_0x0 + (ulong)local_3c * 2) = (short)iVar3;
        iVar3 = Abc_LitIsCompl((uint)*(ushort *)(&pObj_00[1].field_0x0 + (ulong)local_3c * 2));
        if (iVar3 != 0) {
          iVar3 = Abc_LitRegular((uint)*(ushort *)(&pObj_00[1].field_0x0 + (ulong)local_3c * 2));
          *(short *)(&pObj_00[1].field_0x0 + (ulong)local_3c * 2) = (short)iVar3;
          Kit_TruthChangePhase(pOut,(uint)*pObj_00 >> 0x1a,local_3c);
        }
      }
      if (((uint)*pKVar5 >> 0x1a == 3) &&
         ((((*pOut == 0xcacacaca || (*pOut == 0xc5c5c5c5)) || (*pOut == 0x3a3a3a3a)) ||
          (*pOut == 0x35353535)))) {
        if (*pOut == 0xc5c5c5c5) {
          iVar3 = Abc_LitNot((uint)*(ushort *)(pObj_00 + 1));
          *(short *)(pObj_00 + 1) = (short)iVar3;
        }
        else if (*pOut == 0x3a3a3a3a) {
          iVar3 = Abc_LitNot((uint)*(ushort *)&pObj_00[1].field_0x2);
          *(short *)&pObj_00[1].field_0x2 = (short)iVar3;
        }
        else if (*pOut == 0x35353535) {
          iVar3 = Abc_LitNot((uint)*(ushort *)(pObj_00 + 1));
          *(short *)(pObj_00 + 1) = (short)iVar3;
          iVar3 = Abc_LitNot((uint)*(ushort *)&pObj_00[1].field_0x2);
          *(short *)&pObj_00[1].field_0x2 = (short)iVar3;
        }
        *pOut = 0xcacacaca;
        iVar3 = Abc_LitIsCompl((uint)*(ushort *)(pObj_00 + 2));
        if (iVar3 != 0) {
          uVar1 = *(ushort *)(pObj_00 + 1);
          *(undefined2 *)(pObj_00 + 1) = *(undefined2 *)&pObj_00[1].field_0x2;
          *(ushort *)&pObj_00[1].field_0x2 = uVar1 & 0xff;
          iVar3 = Abc_LitNot((uint)*(ushort *)(pObj_00 + 2));
          *(short *)(pObj_00 + 2) = (short)iVar3;
        }
        iVar3 = Abc_LitIsCompl((uint)*(ushort *)&pObj_00[1].field_0x2);
        pTruth._4_4_ = iLit;
        if (iVar3 != 0) {
          pTruth._4_4_ = Abc_LitNot(iLit);
          iVar3 = Abc_LitNot((uint)*(ushort *)(pObj_00 + 1));
          *(short *)(pObj_00 + 1) = (short)iVar3;
          iVar3 = Abc_LitNot((uint)*(ushort *)&pObj_00[1].field_0x2);
          *(short *)&pObj_00[1].field_0x2 = (short)iVar3;
        }
        KVar2 = *pObj_00;
        iVar3 = Abc_LitIsCompl(pTruth._4_4_);
        pNew_local._4_4_ = Abc_Var2Lit((uint)KVar2 & 0x3f,iVar3);
      }
      else {
        iVar3 = Abc_LitIsCompl(iLit);
        if (iVar3 != 0) {
          Kit_TruthNot(pOut,pOut,(uint)*pKVar5 >> 0x1a);
        }
        pNew_local._4_4_ = Abc_Var2Lit((uint)*pObj_00 & 0x3f,0);
      }
    }
  }
  return pNew_local._4_4_;
}

Assistant:

int Kit_DsdExpandNode_rec( Kit_DsdNtk_t * pNew, Kit_DsdNtk_t * p, int iLit )
{
    unsigned * pTruth, * pTruthNew;
    unsigned i, iLitFanin, piLitsNew[16], nLitsNew = 0;
    Kit_DsdObj_t * pObj, * pObjNew;

    // consider the case of simple gate
    pObj = Kit_DsdNtkObj( p, Abc_Lit2Var(iLit) );
    if ( pObj == NULL )
        return iLit;
    if ( pObj->Type == KIT_DSD_AND )
    {
        Kit_DsdExpandCollectAnd_rec( p, Abc_LitRegular(iLit), piLitsNew, (int *)&nLitsNew );
        pObjNew = Kit_DsdObjAlloc( pNew, KIT_DSD_AND, nLitsNew );
        for ( i = 0; i < pObjNew->nFans; i++ )
            pObjNew->pFans[i] = Kit_DsdExpandNode_rec( pNew, p, piLitsNew[i] );
        return Abc_Var2Lit( pObjNew->Id, Abc_LitIsCompl(iLit) );
    }
    if ( pObj->Type == KIT_DSD_XOR )
    {
        int fCompl = Abc_LitIsCompl(iLit);
        Kit_DsdExpandCollectXor_rec( p, Abc_LitRegular(iLit), piLitsNew, (int *)&nLitsNew );
        pObjNew = Kit_DsdObjAlloc( pNew, KIT_DSD_XOR, nLitsNew );
        for ( i = 0; i < pObjNew->nFans; i++ )
        {
            pObjNew->pFans[i] = Kit_DsdExpandNode_rec( pNew, p, Abc_LitRegular(piLitsNew[i]) );
            fCompl ^= Abc_LitIsCompl(piLitsNew[i]);
        }
        return Abc_Var2Lit( pObjNew->Id, fCompl );
    }
    assert( pObj->Type == KIT_DSD_PRIME );

    // create new PRIME node
    pObjNew = Kit_DsdObjAlloc( pNew, KIT_DSD_PRIME, pObj->nFans );
    // copy the truth table
    pTruth = Kit_DsdObjTruth( pObj );
    pTruthNew = Kit_DsdObjTruth( pObjNew );
    Kit_TruthCopy( pTruthNew, pTruth, pObj->nFans );
    // create fanins
    Kit_DsdObjForEachFanin( pNtk, pObj, iLitFanin, i )
    {
        pObjNew->pFans[i] = Kit_DsdExpandNode_rec( pNew, p, iLitFanin );
        // complement the corresponding inputs of the truth table
        if ( Abc_LitIsCompl(pObjNew->pFans[i]) )
        {
            pObjNew->pFans[i] = Abc_LitRegular(pObjNew->pFans[i]);
            Kit_TruthChangePhase( pTruthNew, pObjNew->nFans, i );
        }
    }

    if ( pObj->nFans == 3 && 
        (pTruthNew[0] == 0xCACACACA || pTruthNew[0] == 0xC5C5C5C5 || 
         pTruthNew[0] == 0x3A3A3A3A || pTruthNew[0] == 0x35353535) )
    {
        // translate into regular MUXes
        if ( pTruthNew[0] == 0xC5C5C5C5 )
            pObjNew->pFans[0] = Abc_LitNot(pObjNew->pFans[0]);
        else if ( pTruthNew[0] == 0x3A3A3A3A )
            pObjNew->pFans[1] = Abc_LitNot(pObjNew->pFans[1]);
        else if ( pTruthNew[0] == 0x35353535 )
        {
            pObjNew->pFans[0] = Abc_LitNot(pObjNew->pFans[0]);
            pObjNew->pFans[1] = Abc_LitNot(pObjNew->pFans[1]);
        }
        pTruthNew[0] = 0xCACACACA;
        // resolve the complemented control input
        if ( Abc_LitIsCompl(pObjNew->pFans[2]) )
        {
            unsigned char Temp = pObjNew->pFans[0];
            pObjNew->pFans[0] = pObjNew->pFans[1];
            pObjNew->pFans[1] = Temp;
            pObjNew->pFans[2] = Abc_LitNot(pObjNew->pFans[2]);
        }
        // resolve the complemented true input
        if ( Abc_LitIsCompl(pObjNew->pFans[1]) )
        {
            iLit = Abc_LitNot(iLit);
            pObjNew->pFans[0] = Abc_LitNot(pObjNew->pFans[0]);
            pObjNew->pFans[1] = Abc_LitNot(pObjNew->pFans[1]);
        }
        return Abc_Var2Lit( pObjNew->Id, Abc_LitIsCompl(iLit) );
    }
    else
    {
        // if the incoming phase is complemented, absorb it into the prime node
        if ( Abc_LitIsCompl(iLit) )
            Kit_TruthNot( pTruthNew, pTruthNew, pObj->nFans );
        return Abc_Var2Lit( pObjNew->Id, 0 );
    }
}